

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall higan::LogFile::~LogFile(LogFile *this)

{
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::~unique_ptr
            (&this->file_ptr_);
  std::__cxx11::string::~string((string *)&this->log_prefix_);
  std::__cxx11::string::~string((string *)&this->log_dir_);
  std::unique_ptr<higan::Mutex,_std::default_delete<higan::Mutex>_>::~unique_ptr(&this->mutex_);
  return;
}

Assistant:

LogFile::~LogFile()
{

}